

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::bootstrap(RpcConnectionState *this)

{
  uint *puVar1;
  uint uVar2;
  long *plVar3;
  undefined8 *puVar4;
  SourceLocation location;
  QuestionRef *pQVar5;
  Disposer *node;
  PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  *pPVar6;
  size_t sVar7;
  Refcounted *refcounted;
  Question *pQVar8;
  RpcPipeline *this_00;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *extraout_RDX_02;
  ClientHook *extraout_RDX_03;
  ClientHook *pCVar9;
  RpcConnectionState *in_RSI;
  RpcPipeline *ptrCopy;
  ArrayPtr<const_capnp::PipelineOp> ops;
  Own<capnp::ClientHook,_std::nullptr_t> OVar10;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> message;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> questionRef;
  QuestionId questionId;
  Builder builder;
  undefined8 *local_278;
  long *local_270;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> local_268;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> local_258;
  PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  *pPStackY_248;
  undefined4 in_stack_fffffffffffffdc0;
  QuestionId in_stack_fffffffffffffdc4;
  SegmentBuilder *in_stack_fffffffffffffdc8;
  SegmentBuilder *node_00;
  SegmentBuilder *pSVar11;
  CapTableBuilder *in_stack_fffffffffffffdd0;
  undefined2 *local_228;
  SegmentBuilder *local_1f0;
  CapTableBuilder *pCStack_1e8;
  WirePointer *local_1e0;
  PointerBuilder local_1d8;
  Exception local_1b8;
  
  uVar2 = (in_RSI->connection).tag;
  if (uVar2 == 2) {
    kj::Exception::Exception(&local_1b8,(Exception *)&(in_RSI->connection).field_1);
    newBrokenCap((capnp *)this,&local_1b8);
    kj::Exception::~Exception(&local_1b8);
    pCVar9 = extraout_RDX;
  }
  else {
    if ((in_RSI->idle == true) && (in_RSI->idle = false, uVar2 == 1)) {
      plVar3 = *(long **)((long)&(in_RSI->connection).field_1 + 0x10);
      (**(code **)(*plVar3 + 0x28))(plVar3,0);
    }
    pQVar8 = anon_unknown_18::
             ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::next
                       (&in_RSI->questions,(uint *)&stack0xfffffffffffffdc4);
    pQVar8->isAwaitingReturn = true;
    location.fileName._4_4_ = in_stack_fffffffffffffdc4;
    location.fileName._0_4_ = in_stack_fffffffffffffdc0;
    location.function = (char *)in_stack_fffffffffffffdc8;
    location._16_8_ = in_stack_fffffffffffffdd0;
    kj::
    newPromiseAndFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>
              (location);
    local_268.disposer = (Disposer *)operator_new(0x38);
    pPVar6 = pPStackY_248;
    (((QuestionRef *)local_268.disposer)->super_Refcounted).super_Disposer._vptr_Disposer =
         (_func_int **)&PTR_disposeImpl_006ce258;
    puVar1 = &(in_RSI->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    (((QuestionRef *)local_268.disposer)->connectionState).ptr.disposer =
         &(in_RSI->super_Refcounted).super_Disposer;
    (((QuestionRef *)local_268.disposer)->connectionState).ptr.ptr = in_RSI;
    ((QuestionRef *)local_268.disposer)->id = in_stack_fffffffffffffdc4;
    pPStackY_248 = (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
                    *)0x0;
    (((QuestionRef *)local_268.disposer)->fulfiller).ptr.disposer = (Disposer *)local_258.ptr;
    (((QuestionRef *)local_268.disposer)->fulfiller).ptr.ptr = pPVar6;
    (pQVar8->selfRef).ptr = (QuestionRef *)local_268.disposer;
    (((QuestionRef *)local_268.disposer)->super_Refcounted).refcount = 2;
    local_268.ptr = (QuestionRef *)local_268.disposer;
    local_1b8.ownFile.content.ptr = (char *)local_268.disposer;
    local_1b8.ownFile.content.size_ = (size_t)local_268.disposer;
    kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
    ::attach<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
              ((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
                *)&stack0xfffffffffffffdc8,&local_258);
    node_00 = (SegmentBuilder *)0x0;
    pSVar11 = node_00;
    if ((PromiseArenaMember *)local_258.disposer != (PromiseArenaMember *)0x0) {
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)local_258.disposer);
      local_258.disposer = (Disposer *)in_stack_fffffffffffffdc8;
      in_stack_fffffffffffffdc8 = (SegmentBuilder *)local_258.disposer;
      pSVar11 = node_00;
      if (node_00 != (SegmentBuilder *)0x0) {
        pSVar11 = (SegmentBuilder *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00);
        in_stack_fffffffffffffdc8 = (SegmentBuilder *)local_258.disposer;
      }
    }
    local_258.disposer = (Disposer *)in_stack_fffffffffffffdc8;
    sVar7 = local_1b8.ownFile.content.size_;
    if ((QuestionRef *)local_1b8.ownFile.content.size_ != (QuestionRef *)0x0) {
      local_1b8.ownFile.content.size_ = 0;
      (**(((Refcounted *)local_1b8.ownFile.content.ptr)->super_Disposer)._vptr_Disposer)
                (local_1b8.ownFile.content.ptr,
                 (((Refcounted *)sVar7)->super_Disposer)._vptr_Disposer[-2] +
                 (long)&(((Refcounted *)sVar7)->super_Disposer)._vptr_Disposer);
    }
    puVar4 = *(undefined8 **)((long)&(in_RSI->connection).field_1 + 0x10);
    (**(code **)*puVar4)(&local_278,puVar4,5);
    (**(code **)*local_270)(&local_1f0);
    local_1d8.pointer = local_1e0;
    local_1d8.segment = local_1f0;
    local_1d8.capTable = pCStack_1e8;
    PointerBuilder::initStruct
              ((StructBuilder *)&stack0xfffffffffffffdc8,&local_1d8,(StructSize)0x10001);
    *local_228 = 8;
    local_1d8.segment = pSVar11;
    PointerBuilder::initStruct((StructBuilder *)&local_1b8,&local_1d8,(StructSize)0x10001);
    *(QuestionId *)&(local_1b8.ownFile.content.disposer)->_vptr_ArrayDisposer =
         in_stack_fffffffffffffdc4;
    (**(code **)(*local_270 + 0x10))();
    plVar3 = local_270;
    if (local_270 != (long *)0x0) {
      local_270 = (long *)0x0;
      (**(code **)*local_278)(local_278,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    this_00 = (RpcPipeline *)operator_new(0x228);
    RpcPipeline::RpcPipeline
              (this_00,in_RSI,&local_268,
               (Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>
                *)&local_258);
    puVar1 = &(this_00->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    local_1b8.ownFile.content.ptr = (char *)0x0;
    local_1b8.ownFile.content.size_ = 0;
    local_1b8.ownFile.content.disposer = (ArrayDisposer *)0x0;
    ops.size_ = 0;
    ops.ptr = (PipelineOp *)this_00;
    OVar10 = RpcPipeline::getPipelinedCap((RpcPipeline *)this,ops);
    (**(this_00->super_Refcounted).super_Disposer._vptr_Disposer)
              (&this_00->super_Refcounted,
               (this_00->super_PipelineHook)._vptr_PipelineHook[-2] +
               (long)&(this_00->super_PipelineHook)._vptr_PipelineHook,OVar10.ptr);
    pQVar5 = local_268.ptr;
    pCVar9 = extraout_RDX_00;
    if (local_268.ptr != (QuestionRef *)0x0) {
      local_268.ptr = (QuestionRef *)0x0;
      (**(((Refcounted *)&(local_268.disposer)->_vptr_Disposer)->super_Disposer)._vptr_Disposer)
                (local_268.disposer,
                 (pQVar5->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                 (long)&(pQVar5->super_Refcounted).super_Disposer._vptr_Disposer);
      pCVar9 = extraout_RDX_01;
    }
    pPVar6 = pPStackY_248;
    if (pPStackY_248 !=
        (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
         *)0x0) {
      pPStackY_248 = (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
                      *)0x0;
      (**((local_258.ptr)->super_Refcounted).super_Disposer._vptr_Disposer)
                (local_258.ptr,(long)pPVar6 + *(long *)(*(long *)pPVar6 + -0x10));
      pCVar9 = extraout_RDX_02;
    }
    node = local_258.disposer;
    if ((SegmentBuilder *)local_258.disposer != (SegmentBuilder *)0x0) {
      local_258.disposer = (Disposer *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
      pCVar9 = extraout_RDX_03;
    }
  }
  OVar10.ptr = pCVar9;
  OVar10.disposer = (Disposer *)this;
  return OVar10;
}

Assistant:

kj::Own<ClientHook> bootstrap() {
    if (connection.is<Disconnected>()) {
      return newBrokenCap(kj::cp(connection.get<Disconnected>()));
    }

    setNotIdle();

    QuestionId questionId;
    auto& question = questions.next(questionId);

    question.isAwaitingReturn = true;

    auto paf = kj::newPromiseAndFulfiller<kj::Promise<kj::Own<RpcResponse>>>();

    auto questionRef = kj::refcounted<QuestionRef>(*this, questionId, kj::mv(paf.fulfiller));
    question.selfRef = *questionRef;

    paf.promise = paf.promise.attach(kj::addRef(*questionRef));

    {
      auto message = connection.get<Connected>().connection->newOutgoingMessage(
          messageSizeHint<rpc::Bootstrap>());

      auto builder = message->getBody().initAs<rpc::Message>().initBootstrap();
      builder.setQuestionId(questionId);
      message->send();
    }

    auto pipeline = kj::refcounted<RpcPipeline>(*this, kj::mv(questionRef), kj::mv(paf.promise));

    return pipeline->getPipelinedCap(kj::Array<const PipelineOp>(nullptr));
  }